

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O3

void __thiscall embree::MatteMaterial::~MatteMaterial(MatteMaterial *this)

{
  SceneGraph::Node::~Node((Node *)this);
  alignedUSMFree(this);
  return;
}

Assistant:

struct PREFIX(MatteMaterial) MATERIAL_BASE_CLASS
  {
#if !defined(ISPC) && !defined(CPPTUTORIAL)
    MatteMaterial (const Vec3fa& reflectance)
      : base(MATERIAL_MATTE), reflectance(reflectance) {}
    virtual Material* material() { return &base; }
#endif

    PREFIX(Material) base;
    Vec3fa reflectance;
  }